

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curramt.cpp
# Opt level: O2

int __thiscall
icu_63::CurrencyAmount::clone
          (CurrencyAmount *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CurrencyAmount *this_00;
  
  this_00 = (CurrencyAmount *)UMemory::operator_new((UMemory *)0x80,(size_t)__fn);
  if (this_00 != (CurrencyAmount *)0x0) {
    CurrencyAmount(this_00,this);
  }
  return (int)this_00;
}

Assistant:

UObject* CurrencyAmount::clone() const {
    return new CurrencyAmount(*this);
}